

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

int64_t __thiscall icu_63::Formattable::getInt64(Formattable *this,UErrorCode *status)

{
  UBool UVar1;
  bool bVar2;
  Formattable *this_00;
  int64_t iVar3;
  UErrorCode *status_local;
  Formattable *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    switch(this->fType) {
    case kDouble:
      if ((this->fValue).fDouble <= 9.223372036854776e+18) {
        if (-9.223372036854776e+18 < (this->fValue).fDouble ||
            (this->fValue).fDouble == -9.223372036854776e+18) {
          if ((ABS((this->fValue).fDouble) <= 9007199254740992.0) ||
             (this->fDecimalQuantity == (DecimalQuantity *)0x0)) {
            this_local = (Formattable *)(long)(this->fValue).fDouble;
          }
          else {
            bVar2 = icu_63::number::impl::DecimalQuantity::fitsInLong(this->fDecimalQuantity,true);
            if (bVar2) {
              this_local = (Formattable *)
                           icu_63::number::impl::DecimalQuantity::toLong
                                     (this->fDecimalQuantity,false);
            }
            else {
              *status = U_INVALID_FORMAT_ERROR;
              bVar2 = icu_63::number::impl::DecimalQuantity::isNegative(this->fDecimalQuantity);
              this_local = (Formattable *)0x7fffffffffffffff;
              if (bVar2) {
                this_local = (Formattable *)0x8000000000000000;
              }
            }
          }
        }
        else {
          *status = U_INVALID_FORMAT_ERROR;
          this_local = (Formattable *)0x8000000000000000;
        }
      }
      else {
        *status = U_INVALID_FORMAT_ERROR;
        this_local = (Formattable *)0x7fffffffffffffff;
      }
      break;
    case kLong:
    case kInt64:
      this_local = (this->fValue).fArrayAndCount.fArray;
      break;
    case kObject:
      if ((this->fValue).fObject == (UObject *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return 0;
      }
      UVar1 = instanceOfMeasure((this->fValue).fObject);
      if (UVar1 != '\0') {
        this_00 = Measure::getNumber((Measure *)(this->fValue).fObject);
        iVar3 = getInt64(this_00,status);
        return iVar3;
      }
    default:
      *status = U_INVALID_FORMAT_ERROR;
      this_local = (Formattable *)0x0;
    }
  }
  else {
    this_local = (Formattable *)0x0;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t
Formattable::getInt64(UErrorCode& status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
        
    switch (fType) {
    case Formattable::kLong: 
    case Formattable::kInt64: 
        return fValue.fInt64;
    case Formattable::kDouble:
        if (fValue.fDouble > (double)U_INT64_MAX) {
            status = U_INVALID_FORMAT_ERROR;
            return U_INT64_MAX;
        } else if (fValue.fDouble < (double)U_INT64_MIN) {
            status = U_INVALID_FORMAT_ERROR;
            return U_INT64_MIN;
        } else if (fabs(fValue.fDouble) > U_DOUBLE_MAX_EXACT_INT && fDecimalQuantity != NULL) {
            if (fDecimalQuantity->fitsInLong(true)) {
                return fDecimalQuantity->toLong();
            } else {
                // Unexpected
                status = U_INVALID_FORMAT_ERROR;
                return fDecimalQuantity->isNegative() ? U_INT64_MIN : U_INT64_MAX;
            }
        } else {
            return (int64_t)fValue.fDouble;
        } 
    case Formattable::kObject:
        if (fValue.fObject == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }
        if (instanceOfMeasure(fValue.fObject)) {
            return ((const Measure*) fValue.fObject)->
                getNumber().getInt64(status);
        }
        U_FALLTHROUGH;
    default:
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
}